

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int DisconnectRPLIDARx(RPLIDAR *pRPLIDAR)

{
  int iVar1;
  deque<double,_std::allocator<double>_> local_c0;
  deque<double,_std::allocator<double>_> local_70;
  undefined4 local_20;
  int local_1c;
  int res;
  int id;
  RPLIDAR *pRPLIDAR_local;
  
  local_1c = 0;
  local_20 = 1;
  do {
    if ((RPLIDAR *)addrsRPLIDAR[local_1c] == pRPLIDAR) {
      _res = pRPLIDAR;
      memset(&local_70,0,0x50);
      std::deque<double,_std::allocator<double>_>::deque(&local_70);
      std::deque<double,_std::allocator<double>_>::operator=
                (anglesvectorRPLIDAR + local_1c,&local_70);
      std::deque<double,_std::allocator<double>_>::~deque(&local_70);
      memset(&local_c0,0,0x50);
      std::deque<double,_std::allocator<double>_>::deque(&local_c0);
      std::deque<double,_std::allocator<double>_>::operator=
                (distancesvectorRPLIDAR + local_1c,&local_c0);
      std::deque<double,_std::allocator<double>_>::~deque(&local_c0);
      iVar1 = DisconnectRPLIDAR(_res);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsRPLIDAR[local_1c] = (void *)0x0;
      return 0;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int DisconnectRPLIDARx(RPLIDAR* pRPLIDAR)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsRPLIDAR[id] != pRPLIDAR)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

#ifdef __cplusplus
	anglesvectorRPLIDAR[id] = std::deque<double>();
	distancesvectorRPLIDAR[id] = std::deque<double>();
#endif // __cplusplus

	res = DisconnectRPLIDAR(pRPLIDAR);
	if (res != EXIT_SUCCESS) return res;

	addrsRPLIDAR[id] = NULL;

	return EXIT_SUCCESS;
}